

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_divmod(void)

{
  ulong in_RAX;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *x_02;
  size_t sVar1;
  size_t i;
  ulong uVar2;
  ulong uStack_38;
  uint8_t sizes [2];
  
  uStack_38 = in_RAX;
  x = mp_new(0x100);
  x_00 = mp_new(0x100);
  x_01 = mp_new(0x100);
  x_02 = mp_new(0x100);
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x20);
    if (sVar1 <= uVar2) break;
    random_read(sizes,2);
    mp_random_bits_into(x,uStack_38 >> 0x30 & 0xff);
    mp_random_bits_into(x_00,uStack_38 >> 0x38);
    log_start();
    mp_divmod_into(x,x_00,x_01,x_02);
    log_end();
    uVar2 = uVar2 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  mp_free(x_02);
  return;
}

Assistant:

static void test_mp_divmod(void)
{
    mp_int *n = mp_new(256), *d = mp_new(256);
    mp_int *q = mp_new(256), *r = mp_new(256);

    for (size_t i = 0; i < looplimit(32); i++) {
        uint8_t sizes[2];
        random_read(sizes, 2);
        mp_random_bits_into(n, sizes[0]);
        mp_random_bits_into(d, sizes[1]);
        log_start();
        mp_divmod_into(n, d, q, r);
        log_end();
    }

    mp_free(n);
    mp_free(d);
    mp_free(q);
    mp_free(r);
}